

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

optional<wasm::Name> * __thiscall
wasm::WATParser::Lexer::takeID(optional<wasm::Name> *__return_storage_ptr__,Lexer *this)

{
  char *in_RCX;
  string_view sVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view in;
  undefined1 local_78 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> result;
  char *pcStack_28;
  
  sVar1 = next(this);
  in._M_len = sVar1._M_str;
  in._M_str = in_RCX;
  anon_unknown_0::ident
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)local_78,
             (anon_unknown_0 *)sVar1._M_len,in);
  if (result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
      ._M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>._M_payload.
      _M_value.str.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    this->pos = this->pos + (long)local_78;
    advance(this);
    if (result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>.
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
        _M_payload._48_1_ == '\x01') {
      IString::IString((IString *)
                       &result.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                        ._M_payload.
                        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                        .
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                        ._M_engaged,
                       (string *)
                       ((long)&result.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                               ._M_payload.
                               super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                               .
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                               ._M_payload + 0x10));
    }
    else if (result.
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
             .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
             _M_payload._8_1_ == '\x01') {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_78,2,
                         (long)local_78 - 3);
      Name::Name((Name *)&result.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                          ._M_payload.
                          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                          .
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                          ._M_engaged,bVar2);
    }
    else {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_78,1,
                         0xffffffffffffffff);
      Name::Name((Name *)&result.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                          ._M_payload.
                          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                          .
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                          ._M_engaged,bVar2);
    }
    (__return_storage_ptr__->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len =
         result.
         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>.
         _M_payload.
         super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
         .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>._64_8_;
    (__return_storage_ptr__->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str =
         pcStack_28;
    (__return_storage_ptr__->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::Name>._M_engaged = true;
    std::_Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>::
    ~_Optional_base((_Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                     *)local_78);
  }
  else {
    std::_Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>::
    ~_Optional_base((_Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                     *)local_78);
    (__return_storage_ptr__->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::Name>._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Name> Lexer::takeID() {
  if (auto result = ident(next())) {
    pos += result->span.size();
    advance();
    if (result->str) {
      return Name(*result->str);
    }
    if (result->isStr) {
      // Remove '$' and quotes.
      return Name(result->span.substr(2, result->span.size() - 3));
    }
    // Remove '$'.
    return Name(result->span.substr(1));
  }
  return std::nullopt;
}